

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O2

DecodeStatus DecodeBitfieldMaskOperand(MCInst *Inst,uint Val,uint64_t Address,void *Decoder)

{
  sbyte sVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar2 = Val >> 5 & 0x1f;
  uVar3 = Val & 0x1f;
  sVar1 = (sbyte)uVar3;
  if (uVar2 <= uVar3) {
    sVar1 = (sbyte)uVar2;
  }
  uVar4 = -2 << (sbyte)uVar2 ^ 0xffffffff;
  if (uVar2 == 0x1f) {
    uVar4 = 0xffffffff;
  }
  MCOperand_CreateImm0(Inst,(ulong)(uVar4 ^ -1 << sVar1));
  return (uint)(uVar3 <= uVar2) * 2 + MCDisassembler_SoftFail;
}

Assistant:

static DecodeStatus DecodeBitfieldMaskOperand(MCInst *Inst, unsigned Val,
		uint64_t Address, const void *Decoder)
{
	// This operand encodes a mask of contiguous zeros between a specified MSB
	// and LSB.  To decode it, we create the mask of all bits MSB-and-lower,
	// the mask of all bits LSB-and-lower, and then xor them to create
	// the mask of that's all ones on [msb, lsb].  Finally we not it to
	// create the final mask.
	unsigned msb = fieldFromInstruction_4(Val, 5, 5);
	unsigned lsb = fieldFromInstruction_4(Val, 0, 5);
	uint32_t lsb_mask, msb_mask;

	DecodeStatus S = MCDisassembler_Success;
	if (lsb > msb) {
		Check(&S, MCDisassembler_SoftFail);
		// The check above will cause the warning for the "potentially undefined
		// instruction encoding" but we can't build a bad MCOperand value here
		// with a lsb > msb or else printing the MCInst will cause a crash.
		lsb = msb;
	}

	msb_mask = 0xFFFFFFFF;
	if (msb != 31) msb_mask = (1U << (msb+1)) - 1;
	lsb_mask = (1U << lsb) - 1;

	MCOperand_CreateImm0(Inst, ~(msb_mask ^ lsb_mask));
	return S;
}